

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

void __thiscall
GdlSlotRefExpression::LookupExpCheck(GdlSlotRefExpression *this,bool param_1,Symbol psymFeature)

{
  allocator local_31;
  string local_30;
  
  if (psymFeature != (Symbol)0x0) {
    std::__cxx11::string::string
              ((string *)&local_30,"Setting feature to a slot reference",&local_31);
    GrcErrorList::AddError(&g_errorList,0x876,(GdlObject *)&this->field_0x8,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void GdlSlotRefExpression::LookupExpCheck(bool /*fInIf*/, Symbol psymFeature)
{
	if (psymFeature)
	{
		g_errorList.AddError(2166, this,
			"Setting feature to a slot reference");
	}
}